

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign
          (CImg<unsigned_int> *this,uint *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  uint *puVar5;
  uint *new_data;
  unsigned_long curr_siz;
  unsigned_long siz;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  uint *values_local;
  CImg<unsigned_int> *this_local;
  
  uVar2 = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  if ((values == (uint *)0x0) || (uVar2 == 0)) {
    this_local = assign(this);
  }
  else {
    uVar3 = size(this);
    if ((values == this->_data) && (uVar2 == uVar3)) {
      this_local = assign(this,size_x,size_y,size_z,size_c);
    }
    else {
      this_local = this;
      if ((((this->_is_shared & 1U) == 0) && (this->_data <= values + uVar2)) &&
         (puVar5 = this->_data, uVar3 = size(this), values < puVar5 + uVar3)) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        uVar4 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        puVar5 = (uint *)operator_new__(uVar4);
        memcpy(puVar5,values,uVar2 * 4);
        if (this->_data != (uint *)0x0) {
          operator_delete__(this->_data);
        }
        this->_data = puVar5;
        this->_width = size_x;
        this->_height = size_y;
        this->_depth = size_z;
        this->_spectrum = size_c;
      }
      else {
        assign(this,size_x,size_y,size_z,size_c);
        if ((this->_is_shared & 1U) == 0) {
          memcpy(this->_data,values,uVar2 * 4);
        }
        else {
          memmove(this->_data,values,uVar2 * 4);
        }
      }
    }
  }
  return this_local;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      const unsigned long curr_siz = size();
      if (values==_data && siz==curr_siz) return assign(size_x,size_y,size_z,size_c);
      if (_is_shared || values + siz<_data || values>=_data + size()) {
        assign(size_x,size_y,size_z,size_c);
        if (_is_shared) std::memmove(_data,values,siz*sizeof(T));
        else std::memcpy(_data,values,siz*sizeof(T));
      } else {
        T *new_data = 0;
        try { new_data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                      size_x,size_y,size_z,size_c);
        }
        std::memcpy(new_data,values,siz*sizeof(T));
        delete[] _data; _data = new_data; _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      }
      return *this;
    }